

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamToolsIndex::BamToolsIndex(BamToolsIndex *this,BamReaderPrivate *reader)

{
  bool bVar1;
  undefined8 *in_RDI;
  BamReaderPrivate *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  BamIndex::BamIndex((BamIndex *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__BamToolsIndex_002108d8;
  std::
  vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  ::vector((vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
            *)0x1c36f3);
  *(undefined4 *)(in_RDI + 10) = 1000;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0xb) = 4;
  RaiiWrapper::RaiiWrapper((RaiiWrapper *)(in_RDI + 0xc));
  bVar1 = SystemIsBigEndian();
  *(bool *)(in_RDI + 6) = bVar1;
  return;
}

Assistant:

BamToolsIndex::BamToolsIndex(Internal::BamReaderPrivate* reader)
    : BamIndex(reader)
    , m_blockSize(BamToolsIndex::DEFAULT_BLOCK_LENGTH)
    , m_inputVersion(0)
    , m_outputVersion(BTI_2_0) // latest version - used for writing new index files
{
    m_isBigEndian = BamTools::SystemIsBigEndian();
}